

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O3

Type __thiscall QtPromise::resolve<QList<int>>(QtPromise *this,QList<int> *value)

{
  QSharedData *pQVar1;
  bool bVar2;
  undefined8 *puVar3;
  Data *extraout_RAX;
  PromiseData<QList<int>_> *extraout_RDX;
  PromiseData<QList<int>_> *extraout_RDX_00;
  PromiseData<QList<int>_> *extraout_RDX_01;
  PromiseData<QList<int>_> *extraout_RDX_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QVar5;
  Type TVar6;
  PromiseResolver<QList<int>_> resolver;
  Data *local_50;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_48;
  QPromise<QList<int>_> local_40;
  
  *(undefined ***)this = &PTR__QPromiseBase_0012d8f0;
  puVar3 = (undefined8 *)operator_new(0x68);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *puVar3 = &PTR__PromiseDataBase_0012daf8;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar3 + 2),0);
  *(undefined1 *)(puVar3 + 3) = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  *puVar3 = &PTR__PromiseData_0012da90;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  LOCK();
  *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
  UNLOCK();
  local_40.super_QPromiseBase<QList<int>_>.m_d.d = *(PromiseData<QList<int>_> **)(this + 8);
  if (local_40.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012da58;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            ((PromiseResolver<QList<int>_> *)&local_48,&local_40);
  local_40.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (local_40.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_40.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((local_40.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (local_48.d == (Data *)0x0) {
    local_50 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_50 = local_48.d;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar2 = false;
      QVar5.d = local_48.d;
      goto LAB_0010f189;
    }
  }
  bVar2 = true;
  QVar5.d = (Data *)0x0;
LAB_0010f189:
  QtPromisePrivate::PromiseResolver<QList<int>>::resolve<QList<int>>
            ((PromiseResolver<QList<int>> *)&local_50,value);
  QVar4.d = extraout_RDX;
  if (!bVar2) {
    LOCK();
    ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar5.d,0x10);
      QVar4.d = extraout_RDX_00;
    }
  }
  if (local_50 != (Data *)0x0) {
    LOCK();
    (local_50->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_50->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_50,0x10);
      QVar4.d = extraout_RDX_01;
    }
  }
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_48.d,0x10);
      local_48.d = extraout_RAX;
      QVar4.d = extraout_RDX_02;
    }
  }
  *(undefined ***)this = &PTR__QPromiseBase_0012da58;
  TVar6.super_QPromiseBase<QList<int>_>.m_d.d = QVar4.d;
  TVar6.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)local_48.d;
  return (Type)TVar6.super_QPromiseBase<QList<int>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}